

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.cpp
# Opt level: O2

string * __thiscall
Test::Formats::to_string_abi_cxx11_(string *__return_storage_ptr__,Formats *this,longdouble val)

{
  char buffer [128];
  allocator<char> local_99;
  char local_98 [136];
  
  snprintf(local_98,0x80,"%Lg");
  std::__cxx11::string::string((string *)__return_storage_ptr__,local_98,&local_99);
  return __return_storage_ptr__;
}

Assistant:

std::string Formats::to_string(long double val) {
  char buffer[128];
#ifdef _MSC_VER
  sprintf_s(buffer, sizeof(buffer), "%Lg", val);
#else
  snprintf(buffer, sizeof(buffer), "%Lg", val);
#endif
  return buffer;
}